

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void disas_not(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  int opsize;
  TCGContext_conflict2 *s_00;
  TCGv_i32 pTVar1;
  TCGTemp *a1;
  uintptr_t o;
  int mode;
  uint mode_00;
  int reg0;
  TCGv_i32 addr;
  
  s_00 = s->uc->tcg_ctx;
  opsize = *(int *)(&DAT_00d886a4 + (insn >> 4 & 0xc));
  mode_00 = insn >> 3 & 7;
  pTVar1 = gen_ea_mode(env,s,mode_00,insn & 7,opsize,s_00->NULL_QREG,&addr,EA_LOADS,
                       (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  if (pTVar1 != s_00->NULL_QREG) {
    a1 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
    tcg_gen_op2_m68k(s_00,INDEX_op_not_i32,(TCGArg)a1,(TCGArg)(pTVar1 + (long)s_00));
    pTVar1 = gen_ea_mode(env,s,mode_00,insn & 7,opsize,(TCGv_i32)((long)a1 - (long)s_00),&addr,
                         EA_STORE,(uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
    if (pTVar1 != s_00->NULL_QREG) {
      gen_logic_cc(s,(TCGv_i32)((long)a1 - (long)s_00),opsize);
      return;
    }
  }
  gen_exception(s,(s->base).pc_next,3);
  return;
}

Assistant:

DISAS_INSN(not)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src1;
    TCGv dest;
    TCGv addr;
    int opsize;

    opsize = insn_opsize(insn);
    SRC_EA(env, src1, opsize, 1, &addr);
    dest = tcg_temp_new(tcg_ctx);
    tcg_gen_not_i32(tcg_ctx, dest, src1);
    DEST_EA(env, insn, opsize, dest, &addr);
    gen_logic_cc(s, dest, opsize);
}